

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.cpp
# Opt level: O3

void __thiscall
Ptex::v2_4::PtexSeparableFilter::apply
          (PtexSeparableFilter *this,PtexSeparableKernel *k,int faceid,FaceInfo *f)

{
  byte bVar1;
  DataType DVar2;
  uint uVar3;
  code *pcVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  long *plVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  float *pfVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  undefined8 uStack_f0;
  float local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  float *local_d0;
  float *local_c8;
  undefined4 local_c0;
  undefined4 local_98;
  undefined4 local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  float *local_58;
  PtexSeparableFilter *local_50;
  float *local_48;
  long *local_40;
  char local_31;
  
  pfVar12 = &local_e8;
  if (k->uw < 1) {
    return;
  }
  if (k->vw < 1) {
    return;
  }
  bVar1 = (k->res).ulog2;
  while (1 << ((f->res).ulog2 & 0x1fU) < 1 << (bVar1 & 0x1f)) {
    uStack_f0 = 0x10ef94;
    PtexSeparableKernel::downresU(k);
    bVar1 = (k->res).ulog2;
  }
  if (1 << ((f->res).vlog2 & 0x1fU) < 1 << ((k->res).vlog2 & 0x1fU)) {
    do {
      uStack_f0 = 0x10efc0;
      PtexSeparableKernel::downresV(k);
    } while (1 << ((f->res).vlog2 & 0x1fU) < 1 << ((k->res).vlog2 & 0x1fU));
  }
  uStack_f0 = 0x10efed;
  iVar7 = (*this->_tx->_vptr_PtexTexture[0x14])(this->_tx,(ulong)(uint)faceid,(ulong)*(uint *)k);
  local_40 = (long *)CONCAT44(extraout_var,iVar7);
  if (local_40 == (long *)0x0) {
    return;
  }
  uStack_f0 = 0x10f003;
  cVar6 = (**(code **)(*local_40 + 0x18))();
  plVar9 = local_40;
  if (cVar6 != '\0') {
    local_58 = this->_result;
    uStack_f0 = 0x10f019;
    lVar8 = (**(code **)(*local_40 + 0x30))();
    iVar7 = this->_firstChanOffset;
    DVar2 = this->_dt;
    uVar3 = this->_nchan;
    uStack_f0 = 0x10f033;
    PtexSeparableKernel::weight(k);
    uVar11 = 0;
    if (uVar3 < 5) {
      uVar11 = (ulong)(uVar3 * 4);
    }
    uStack_f0 = 0x10f05e;
    (**(code **)(PtexUtils::applyConstFunctions + (uVar11 + (long)(int)DVar2) * 8))
              (local_58,lVar8 + iVar7,uVar3);
    goto LAB_0010f44c;
  }
  uVar3 = this->_nchan;
  bVar19 = this->_efm == efm_tanvec;
  bVar5 = 0 < k->rot;
  local_31 = (bVar5 && 1 < (int)uVar3) && bVar19;
  if ((bVar5 && 1 < (int)uVar3) && bVar19) {
    lVar8 = -((ulong)uVar3 * 4 + 0xf & 0xfffffffffffffff0);
    pfVar18 = (float *)((long)&local_e8 + lVar8);
    *(undefined8 *)((long)&uStack_f0 + lVar8) = 0x10f0b3;
    memset(pfVar18,0,(ulong)uVar3 << 2);
    pfVar12 = pfVar18;
  }
  else {
    pfVar18 = this->_result;
    pfVar12 = &local_e8;
  }
  pcVar4 = *(code **)(*plVar9 + 0x38);
  pfVar12[-2] = 1.555736e-39;
  pfVar12[-1] = 0.0;
  cVar6 = (*pcVar4)(plVar9);
  if (cVar6 == '\0') {
    pcVar4 = *(code **)(*plVar9 + 0x30);
    pfVar12[-2] = 1.556618e-39;
    pfVar12[-1] = 0.0;
    lVar8 = (*pcVar4)();
    iVar7 = this->_firstChanOffset;
    uVar3 = this->_nchan;
    iVar15 = 0;
    if (uVar3 < 5) {
      iVar15 = uVar3 * 4;
    }
    iVar13 = iVar15 + 0x14;
    if (uVar3 == this->_ntxchan) {
      iVar13 = iVar15;
    }
    pcVar4 = *(code **)(PtexSeparableKernel::applyFunctions + (long)(int)(iVar13 + this->_dt) * 8);
    pfVar12[-2] = 1.556716e-39;
    pfVar12[-1] = 0.0;
    (*pcVar4)(k,pfVar18,lVar8 + iVar7);
  }
  else {
    pcVar4 = *(code **)(*plVar9 + 0x40);
    local_50 = this;
    local_48 = pfVar18;
    pfVar12[-2] = 1.55577e-39;
    pfVar12[-1] = 0.0;
    local_e8._0_2_ = (*pcVar4)(plVar9);
    local_70 = 0;
    local_c0 = 0;
    local_98 = 0;
    iVar7 = 1 << ((byte)local_e8._0_2_ & 0x1f);
    local_60 = 1 << ((byte)((ushort)local_e8._0_2_ >> 8) & 0x1f);
    local_58 = (float *)CONCAT44(local_58._4_4_,iVar7);
    local_5c = (1 << ((k->res).ulog2 & 0x1fU)) / iVar7;
    iVar7 = k->vw;
    this = local_50;
    pfVar18 = local_48;
    if (0 < iVar7) {
      iVar15 = k->v;
      do {
        local_e0 = iVar15 % local_60;
        local_d8 = local_60 - iVar15 % local_60;
        if (iVar7 < local_d8) {
          local_d8 = iVar7;
        }
        local_c8 = k->kv + ((long)iVar15 - (long)k->v);
        iVar13 = iVar7;
        if (0 < k->uw) {
          iVar16 = k->u;
          iVar17 = k->uw;
          local_68 = iVar7;
          local_64 = iVar15;
          do {
            local_e4 = iVar16 % (int)local_58;
            local_dc = (int)local_58 - local_e4;
            if (iVar17 < (int)local_58 - local_e4) {
              local_dc = iVar17;
            }
            local_d0 = k->ku + ((long)iVar16 - (long)k->u);
            pcVar4 = *(code **)(*plVar9 + 0x48);
            pfVar12[-2] = 1.556124e-39;
            pfVar12[-1] = 0.0;
            plVar9 = (long *)(*pcVar4)(plVar9);
            if (plVar9 != (long *)0x0) {
              pcVar4 = *(code **)(*plVar9 + 0x18);
              pfVar12[-2] = 1.556153e-39;
              pfVar12[-1] = 0.0;
              cVar6 = (*pcVar4)(plVar9);
              pcVar4 = *(code **)(*plVar9 + 0x30);
              if (cVar6 == '\0') {
                pfVar12[-2] = 1.556401e-39;
                pfVar12[-1] = 0.0;
                lVar8 = (*pcVar4)(plVar9);
                pfVar18 = local_48;
                iVar7 = local_50->_firstChanOffset;
                uVar3 = local_50->_nchan;
                iVar15 = uVar3 * 4;
                if (4 < uVar3) {
                  iVar15 = 0;
                }
                iVar13 = iVar15 + 0x14;
                if (uVar3 == local_50->_ntxchan) {
                  iVar13 = iVar15;
                }
                pcVar4 = *(code **)(PtexSeparableKernel::applyFunctions +
                                   (long)(int)(iVar13 + local_50->_dt) * 8);
                pfVar12[-2] = 1.556513e-39;
                pfVar12[-1] = 0.0;
                (*pcVar4)(&local_e8,pfVar18,lVar8 + iVar7);
              }
              else {
                pfVar12[-2] = 1.556181e-39;
                pfVar12[-1] = 0.0;
                lVar8 = (*pcVar4)(plVar9);
                pfVar18 = local_48;
                fVar21 = 0.0;
                fVar20 = 0.0;
                if ((long)local_dc != 0) {
                  lVar14 = 0;
                  do {
                    fVar20 = fVar20 + *(float *)((long)local_d0 + lVar14);
                    lVar14 = lVar14 + 4;
                  } while ((long)local_dc * 4 != lVar14);
                }
                if ((long)local_d8 != 0) {
                  fVar21 = 0.0;
                  lVar14 = 0;
                  do {
                    fVar21 = fVar21 + *(float *)((long)local_c8 + lVar14);
                    lVar14 = lVar14 + 4;
                  } while ((long)local_d8 * 4 != lVar14);
                }
                iVar7 = local_50->_firstChanOffset;
                uVar3 = local_50->_nchan * 4;
                if (4 < (uint)local_50->_nchan) {
                  uVar3 = 0;
                }
                pcVar4 = *(code **)(PtexUtils::applyConstFunctions +
                                   ((ulong)uVar3 + (long)(int)local_50->_dt) * 8);
                pfVar12[-2] = 1.556391e-39;
                pfVar12[-1] = 0.0;
                (*pcVar4)(fVar20 * fVar21,pfVar18,lVar8 + iVar7);
              }
              pcVar4 = *(code **)(*plVar9 + 0x10);
              pfVar12[-2] = 1.556526e-39;
              pfVar12[-1] = 0.0;
              (*pcVar4)(plVar9);
            }
            iVar16 = iVar16 + local_dc;
            iVar7 = iVar17 - local_dc;
            bVar5 = local_dc <= iVar17;
            plVar9 = local_40;
            iVar13 = local_68;
            iVar15 = local_64;
            iVar17 = iVar7;
          } while (iVar7 != 0 && bVar5);
        }
        iVar15 = iVar15 + local_d8;
        iVar7 = iVar13 - local_d8;
        this = local_50;
        pfVar18 = local_48;
      } while (iVar7 != 0 && local_d8 <= iVar13);
    }
  }
  if (local_31 == '\0') goto LAB_0010f44c;
  switch(k->rot) {
  case 0:
    pfVar10 = this->_result;
    *pfVar10 = *pfVar18 + *pfVar10;
    fVar20 = pfVar18[1];
    goto LAB_0010f417;
  case 1:
    pfVar10 = this->_result;
    *pfVar10 = *pfVar10 - pfVar18[1];
    fVar20 = *pfVar18;
LAB_0010f417:
    fVar20 = fVar20 + pfVar10[1];
LAB_0010f41c:
    pfVar10[1] = fVar20;
    break;
  case 2:
    pfVar10 = this->_result;
    *pfVar10 = *pfVar10 - *pfVar18;
    pfVar10[1] = pfVar10[1] - pfVar18[1];
    break;
  case 3:
    pfVar10 = this->_result;
    *pfVar10 = pfVar18[1] + *pfVar10;
    fVar20 = pfVar10[1] - *pfVar18;
    goto LAB_0010f41c;
  }
  iVar7 = this->_nchan;
  if (2 < (long)iVar7) {
    pfVar10 = this->_result;
    lVar8 = 2;
    do {
      pfVar10[lVar8] = pfVar18[lVar8] + pfVar10[lVar8];
      lVar8 = lVar8 + 1;
    } while (iVar7 != lVar8);
  }
LAB_0010f44c:
  pcVar4 = *(code **)(*local_40 + 0x10);
  *(undefined8 *)((long)pfVar12 + -8) = 0x10f456;
  (*pcVar4)();
  return;
}

Assistant:

void PtexSeparableFilter::apply(PtexSeparableKernel& k, int faceid, const Ptex::FaceInfo& f)
{
    assert(k.u >= 0 && k.u + k.uw <= k.res.u());
    assert(k.v >= 0 && k.v + k.vw <= k.res.v());

    if (k.uw <= 0 || k.vw <= 0) return;

    // downres kernel if needed
    while (k.res.u() > f.res.u()) k.downresU();
    while (k.res.v() > f.res.v()) k.downresV();

    // get face data, and apply
    PtexPtr<PtexFaceData> dh ( _tx->getData(faceid, k.res) );
    if (!dh) return;

    if (dh->isConstant()) {
        k.applyConst(_result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan);
        return;
    }

    // allocate temporary result for tanvec mode (if needed)
    bool tanvecMode = (_efm == efm_tanvec) && (_nchan >= 2) && (k.rot > 0);
    float* result = tanvecMode ? (float*) alloca(sizeof(float)*_nchan) : _result;
    if (tanvecMode) memset(result, 0, sizeof(float)*_nchan);

    if (dh->isTiled()) {
        Ptex::Res tileres = dh->tileRes();
        PtexSeparableKernel kt;
        kt.res = tileres;
        int tileresu = tileres.u();
        int tileresv = tileres.v();
        int ntilesu = k.res.u() / tileresu;
        for (int v = k.v, vw = k.vw; vw > 0; vw -= kt.vw, v += kt.vw) {
            int tilev = v / tileresv;
            kt.v = v % tileresv;
            kt.vw = PtexUtils::min(vw, tileresv - kt.v);
            kt.kv = k.kv + v - k.v;
            for (int u = k.u, uw = k.uw; uw > 0; uw -= kt.uw, u += kt.uw) {
                int tileu = u / tileresu;
                kt.u = u % tileresu;
                kt.uw = PtexUtils::min(uw, tileresu - kt.u);
                kt.ku = k.ku + u - k.u;
                PtexPtr<PtexFaceData> th ( dh->getTile(tilev * ntilesu + tileu) );
                if (th) {
                    if (th->isConstant())
                        kt.applyConst(result, (char*)th->getData()+_firstChanOffset, _dt, _nchan);
                    else
                        kt.apply(result, (char*)th->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
                }
            }
        }
    }
    else {
        k.apply(result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
    }

    if (tanvecMode) {
        // rotate tangent-space vector data and update main result
        switch (k.rot) {
            case 0: // rot==0 included for completeness, but tanvecMode should be false in this case
                _result[0] += result[0];
                _result[1] += result[1];
                break;
            case 1:
                _result[0] -= result[1];
                _result[1] += result[0];
                break;
            case 2:
                _result[0] -= result[0];
                _result[1] -= result[1];
                break;
            case 3:
                _result[0] += result[1];
                _result[1] -= result[0];
                break;
        }
        for (int i = 2; i < _nchan; i++) _result[i] += result[i];
    }
}